

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

int32_t __thiscall
aeron::archive::AeronArchive::listRecordingsForUri
          (AeronArchive *this,int64_t fromRecordingId,int32_t recordCount,string *channelFragment,
          int32_t streamId,RecordingDescriptorConsumer *consumer)

{
  int64_t iVar1;
  anon_class_40_5_8bc4d550 local_80;
  function<bool_(long)> local_58;
  RecordingDescriptorConsumer *local_38;
  RecordingDescriptorConsumer *consumer_local;
  string *psStack_28;
  int32_t streamId_local;
  string *channelFragment_local;
  int64_t iStack_18;
  int32_t recordCount_local;
  int64_t fromRecordingId_local;
  AeronArchive *this_local;
  
  local_80.fromRecordingId = &stack0xffffffffffffffe8;
  local_80.recordCount = (int32_t *)((long)&channelFragment_local + 4);
  local_80.streamId = (int32_t *)((long)&consumer_local + 4);
  local_80.this = this;
  local_80.channelFragment = channelFragment;
  local_38 = consumer;
  consumer_local._4_4_ = streamId;
  psStack_28 = channelFragment;
  channelFragment_local._4_4_ = recordCount;
  iStack_18 = fromRecordingId;
  fromRecordingId_local = (int64_t)this;
  std::function<bool(long)>::
  function<aeron::archive::AeronArchive::listRecordingsForUri(long,int,std::__cxx11::string_const&,int,std::function<void(long,long,long,long,long,long,long,int,int,int,int,int,int,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)>&&)::__0,void>
            ((function<bool(long)> *)&local_58,&local_80);
  iVar1 = callAndPollForDescriptors
                    (this,&local_58,channelFragment_local._4_4_,local_38,"list recordings for URI");
  std::function<bool_(long)>::~function(&local_58);
  return (int32_t)iVar1;
}

Assistant:

std::int32_t AeronArchive::listRecordingsForUri(std::int64_t fromRecordingId, std::int32_t recordCount,
                                                const std::string& channelFragment, std::int32_t streamId,
                                                RecordingDescriptorConsumer&& consumer) {
    return callAndPollForDescriptors(
        [&](std::int64_t correlationId) {
            return archiveProxy_->listRecordingsForUri(fromRecordingId, recordCount, channelFragment, streamId, correlationId,
                                                       controlSessionId_);
        },
        recordCount, std::move(consumer), "list recordings for URI");
}